

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

void __thiscall BackwardPass::DeleteBlockData(BackwardPass *this,BasicBlock *block)

{
  AllocatorType *allocator;
  code *pcVar1;
  bool bVar2;
  RegSlot RVar3;
  undefined4 *puVar4;
  JITTimeFunctionBody *this_00;
  AllocatorType *local_48;
  AllocatorType *local_40;
  JitArenaAllocator *upwardExposedArena_1;
  JitArenaAllocator *upwardExposedArena;
  JitArenaAllocator *liveFixedFieldsArena;
  BasicBlock *block_local;
  BackwardPass *this_local;
  
  if (block->slotDeadStoreCandidates != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
              (this->tempAlloc,block->slotDeadStoreCandidates);
    block->slotDeadStoreCandidates = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  }
  if (block->tempNumberTracker != (TempNumberTracker *)0x0) {
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,TempTracker<NumberTemp>>
              (this->tempAlloc,block->tempNumberTracker);
    block->tempNumberTracker = (TempNumberTracker *)0x0;
  }
  if (block->tempObjectTracker != (TempObjectTracker *)0x0) {
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,TempTracker<ObjectTemp>>
              (this->tempAlloc,block->tempObjectTracker);
    block->tempObjectTracker = (TempObjectTracker *)0x0;
  }
  if (block->tempObjectVerifyTracker != (TempObjectVerifyTracker *)0x0) {
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,TempTracker<ObjectTempVerify>>
              (this->tempAlloc,block->tempObjectVerifyTracker);
    block->tempObjectVerifyTracker = (TempObjectVerifyTracker *)0x0;
  }
  if (block->stackSymToFinalType != (HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator> *)0x0
     ) {
    HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator>::Delete(block->stackSymToFinalType);
    block->stackSymToFinalType = (HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator> *)0x0;
  }
  if (block->stackSymToGuardedProperties !=
      (HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator> *)0x0) {
    HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator>::Delete
              (block->stackSymToGuardedProperties);
    block->stackSymToGuardedProperties =
         (HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator> *)0x0;
  }
  if (block->stackSymToWriteGuardsMap !=
      (HashTable<ObjWriteGuardBucket,_Memory::ArenaAllocator> *)0x0) {
    HashTable<ObjWriteGuardBucket,_Memory::ArenaAllocator>::Delete(block->stackSymToWriteGuardsMap);
    block->stackSymToWriteGuardsMap = (HashTable<ObjWriteGuardBucket,_Memory::ArenaAllocator> *)0x0;
  }
  if (block->cloneStrCandidates != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    if (this->tag != BackwardPhase) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x52b,"(this->tag == Js::BackwardPhase)","this->tag == Js::BackwardPhase")
      ;
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
              (this->globOpt->alloc,block->cloneStrCandidates);
    block->cloneStrCandidates = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  }
  if (block->noImplicitCallUses != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
              (this->tempAlloc,block->noImplicitCallUses);
    block->noImplicitCallUses = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  }
  if (block->noImplicitCallNoMissingValuesUses != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
              (this->tempAlloc,block->noImplicitCallNoMissingValuesUses);
    block->noImplicitCallNoMissingValuesUses = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  }
  if (block->noImplicitCallNativeArrayUses != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
              (this->tempAlloc,block->noImplicitCallNativeArrayUses);
    block->noImplicitCallNativeArrayUses = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  }
  if (block->noImplicitCallJsArrayHeadSegmentSymUses != (BVSparse<Memory::JitArenaAllocator> *)0x0)
  {
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
              (this->tempAlloc,block->noImplicitCallJsArrayHeadSegmentSymUses);
    block->noImplicitCallJsArrayHeadSegmentSymUses = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  }
  if (block->noImplicitCallArrayLengthSymUses != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
              (this->tempAlloc,block->noImplicitCallArrayLengthSymUses);
    block->noImplicitCallArrayLengthSymUses = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  }
  if (block->liveFixedFields != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
              (this->tempAlloc,block->liveFixedFields);
    block->liveFixedFields = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  }
  if (block->upwardExposedUses != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    if (this->tag == BackwardPhase) {
      local_40 = this->globOpt->alloc;
    }
    else {
      local_40 = this->tempAlloc;
    }
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
              (local_40,block->upwardExposedUses);
    block->upwardExposedUses = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  }
  if (block->upwardExposedFields != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    if (this->tag == BackwardPhase) {
      local_48 = this->globOpt->alloc;
    }
    else {
      local_48 = this->tempAlloc;
    }
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
              (local_48,block->upwardExposedFields);
    block->upwardExposedFields = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  }
  if (block->typesNeedingKnownObjectLayout != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
              (this->tempAlloc,block->typesNeedingKnownObjectLayout);
    block->typesNeedingKnownObjectLayout = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  }
  if (block->byteCodeUpwardExposedUsed != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
              (this->tempAlloc,block->byteCodeUpwardExposedUsed);
    block->byteCodeUpwardExposedUsed = (BVSparse<Memory::JitArenaAllocator> *)0x0;
    allocator = this->tempAlloc;
    this_00 = Func::GetJITFunctionBody(this->func);
    RVar3 = JITTimeFunctionBody::GetLocalsCount(this_00);
    Memory::DeleteArray<Memory::JitArenaAllocator,StackSym*>
              (allocator,(ulong)RVar3,block->byteCodeRestoreSyms);
    block->byteCodeRestoreSyms = (StackSym **)0x0;
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
              (this->tempAlloc,block->excludeByteCodeUpwardExposedTracking);
    block->excludeByteCodeUpwardExposedTracking = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  }
  if (block->couldRemoveNegZeroBailoutForDef != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
              (this->tempAlloc,block->couldRemoveNegZeroBailoutForDef);
    block->couldRemoveNegZeroBailoutForDef = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  }
  return;
}

Assistant:

void
BackwardPass::DeleteBlockData(BasicBlock * block)
{
    if (block->slotDeadStoreCandidates != nullptr)
    {
        JitAdelete(this->tempAlloc, block->slotDeadStoreCandidates);
        block->slotDeadStoreCandidates = nullptr;
    }
    if (block->tempNumberTracker != nullptr)
    {
        JitAdelete(this->tempAlloc, block->tempNumberTracker);
        block->tempNumberTracker = nullptr;
    }
    if (block->tempObjectTracker != nullptr)
    {
        JitAdelete(this->tempAlloc, block->tempObjectTracker);
        block->tempObjectTracker = nullptr;
    }
#if DBG
    if (block->tempObjectVerifyTracker != nullptr)
    {
        JitAdelete(this->tempAlloc, block->tempObjectVerifyTracker);
        block->tempObjectVerifyTracker = nullptr;
    }
#endif
    if (block->stackSymToFinalType != nullptr)
    {
        block->stackSymToFinalType->Delete();
        block->stackSymToFinalType = nullptr;
    }
    if (block->stackSymToGuardedProperties != nullptr)
    {
        block->stackSymToGuardedProperties->Delete();
        block->stackSymToGuardedProperties = nullptr;
    }
    if (block->stackSymToWriteGuardsMap != nullptr)
    {
        block->stackSymToWriteGuardsMap->Delete();
        block->stackSymToWriteGuardsMap = nullptr;
    }
    if (block->cloneStrCandidates != nullptr)
    {
        Assert(this->tag == Js::BackwardPhase);
        JitAdelete(this->globOpt->alloc, block->cloneStrCandidates);
        block->cloneStrCandidates = nullptr;
    }
    if (block->noImplicitCallUses != nullptr)
    {
        JitAdelete(this->tempAlloc, block->noImplicitCallUses);
        block->noImplicitCallUses = nullptr;
    }
    if (block->noImplicitCallNoMissingValuesUses != nullptr)
    {
        JitAdelete(this->tempAlloc, block->noImplicitCallNoMissingValuesUses);
        block->noImplicitCallNoMissingValuesUses = nullptr;
    }
    if (block->noImplicitCallNativeArrayUses != nullptr)
    {
        JitAdelete(this->tempAlloc, block->noImplicitCallNativeArrayUses);
        block->noImplicitCallNativeArrayUses = nullptr;
    }
    if (block->noImplicitCallJsArrayHeadSegmentSymUses != nullptr)
    {
        JitAdelete(this->tempAlloc, block->noImplicitCallJsArrayHeadSegmentSymUses);
        block->noImplicitCallJsArrayHeadSegmentSymUses = nullptr;
    }
    if (block->noImplicitCallArrayLengthSymUses != nullptr)
    {
        JitAdelete(this->tempAlloc, block->noImplicitCallArrayLengthSymUses);
        block->noImplicitCallArrayLengthSymUses = nullptr;
    }
    if (block->liveFixedFields != nullptr)
    {
        JitArenaAllocator *liveFixedFieldsArena = this->tempAlloc;
        JitAdelete(liveFixedFieldsArena, block->liveFixedFields);
        block->liveFixedFields = nullptr;
    }
    if (block->upwardExposedUses != nullptr)
    {
        JitArenaAllocator *upwardExposedArena = (this->tag == Js::BackwardPhase) ? this->globOpt->alloc : this->tempAlloc;
        JitAdelete(upwardExposedArena, block->upwardExposedUses);
        block->upwardExposedUses = nullptr;
    }
    if (block->upwardExposedFields != nullptr)
    {
        JitArenaAllocator *upwardExposedArena = (this->tag == Js::BackwardPhase) ? this->globOpt->alloc : this->tempAlloc;
        JitAdelete(upwardExposedArena, block->upwardExposedFields);
        block->upwardExposedFields = nullptr;
    }
    if (block->typesNeedingKnownObjectLayout != nullptr)
    {
        JitAdelete(this->tempAlloc, block->typesNeedingKnownObjectLayout);
        block->typesNeedingKnownObjectLayout = nullptr;
    }
    if (block->byteCodeUpwardExposedUsed != nullptr)
    {
        JitAdelete(this->tempAlloc, block->byteCodeUpwardExposedUsed);
        block->byteCodeUpwardExposedUsed = nullptr;
#if DBG
        JitAdeleteArray(this->tempAlloc, func->GetJITFunctionBody()->GetLocalsCount(), block->byteCodeRestoreSyms);
        block->byteCodeRestoreSyms = nullptr;
        JitAdelete(this->tempAlloc, block->excludeByteCodeUpwardExposedTracking);
        block->excludeByteCodeUpwardExposedTracking = nullptr;
#endif
    }
    if (block->couldRemoveNegZeroBailoutForDef != nullptr)
    {
        JitAdelete(this->tempAlloc, block->couldRemoveNegZeroBailoutForDef);
        block->couldRemoveNegZeroBailoutForDef = nullptr;
    }
}